

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_value.cpp
# Opt level: O0

value_ptr __thiscall pstore::dump::make_value(dump *this,trailer *trailer,bool no_times)

{
  initializer_list<pstore::dump::object::member> __l;
  atomic<unsigned_int> *paVar1;
  atomic<unsigned_long> *paVar2;
  __int_type_conflict1 ms;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  value_ptr vVar3;
  member *local_510;
  allocator<pstore::dump::object::member> local_41a;
  undefined1 local_419;
  const_iterator local_418;
  const_iterator local_410;
  value_ptr local_408;
  allocator local_3f1;
  string local_3f0;
  value_ptr local_3d0;
  allocator local_3b9;
  string local_3b8;
  const_iterator local_398;
  const_iterator local_390;
  value_ptr local_388;
  allocator local_371;
  string local_370;
  address local_350;
  value_ptr local_348;
  allocator local_331;
  string local_330;
  value_ptr local_310;
  allocator local_2f9;
  string local_2f8;
  __int_type_conflict1 local_2d8;
  value_ptr local_2d0;
  allocator local_2b9;
  string local_2b8;
  __int_type_conflict local_294;
  value_ptr local_290;
  allocator local_279;
  string local_278;
  const_iterator local_258;
  const_iterator local_250;
  value_ptr local_248 [2];
  allocator local_221;
  string local_220;
  member *local_200;
  member local_1f8;
  member local_1c8;
  member local_198;
  member local_168;
  member local_138;
  member local_108;
  member local_d8;
  member local_a8;
  iterator local_78;
  size_type local_70;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_68;
  byte local_49;
  trailer *ptStack_48;
  bool no_times_local;
  trailer *trailer_local;
  __int_type_conflict local_34;
  memory_order local_30;
  int local_2c;
  memory_order __b;
  __int_type_conflict1 local_20;
  memory_order local_18;
  int local_14;
  memory_order __b_1;
  
  local_419 = 1;
  local_200 = &local_1f8;
  local_49 = no_times;
  ptStack_48 = trailer;
  trailer_local = (trailer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,"signature1",&local_221);
  local_250 = std::begin<std::array<unsigned_char,8ul>>((array<unsigned_char,_8UL> *)ptStack_48);
  local_258 = std::end<std::array<unsigned_char,8ul>>((array<unsigned_char,_8UL> *)ptStack_48);
  make_value<unsigned_char_const*,unsigned_char,std::shared_ptr<pstore::dump::value>(*)(unsigned_char_const&)>
            ((dump *)local_248,&local_250,&local_258,
             details::default_make_value<unsigned_char_const&>);
  object::member::member(&local_1f8,&local_220,local_248);
  local_200 = &local_1c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_278,"generation",&local_279);
  paVar1 = &(ptStack_48->a).generation;
  local_2c = 5;
  ___b = paVar1;
  local_30 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (local_2c - 1U < 2) {
    local_34 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  }
  else if (local_2c == 5) {
    local_34 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  }
  else {
    local_34 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  }
  local_294 = local_34;
  make_value((dump *)&local_290,&local_294);
  object::member::member(&local_1c8,&local_278,&local_290);
  local_200 = &local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b8,"size",&local_2b9);
  paVar2 = &(ptStack_48->a).size;
  local_14 = 5;
  ___b_1 = paVar2;
  local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (local_14 - 1U < 2) {
    local_20 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
  }
  else if (local_14 == 5) {
    local_20 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
  }
  else {
    local_20 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
  }
  local_2d8 = local_20;
  make_value((dump *)&local_2d0,&local_2d8);
  object::member::member(&local_198,&local_2b8,&local_2d0);
  local_200 = &local_168;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f8,"time",&local_2f9);
  ms = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)&(ptStack_48->a).time);
  make_time((dump *)&local_310,ms,(bool)(local_49 & 1));
  object::member::member(&local_168,&local_2f8,&local_310);
  local_200 = &local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_330,"prev_generation",&local_331);
  local_350.a_ = (ptStack_48->a).prev_generation.a_.a_;
  make_value<pstore::trailer>((dump *)&local_348,(typed_address<pstore::trailer>)local_350.a_);
  object::member::member(&local_138,&local_330,&local_348);
  local_200 = &local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_370,"indices",&local_371);
  local_390 = std::begin<std::array<pstore::typed_address<pstore::index::header_block>,6ul>>
                        (&(ptStack_48->a).index_records);
  local_398 = std::end<std::array<pstore::typed_address<pstore::index::header_block>,6ul>>
                        (&(ptStack_48->a).index_records);
  make_value<pstore::typed_address<pstore::index::header_block>const*,pstore::typed_address<pstore::index::header_block>,std::shared_ptr<pstore::dump::value>(*)(pstore::typed_address<pstore::index::header_block>const&)>
            ((dump *)&local_388,&local_390,&local_398,
             details::default_make_value<pstore::typed_address<pstore::index::header_block>const&>);
  object::member::member(&local_108,&local_370,&local_388);
  local_200 = &local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3b8,"crc",&local_3b9);
  make_value((dump *)&local_3d0,&ptStack_48->crc);
  object::member::member(&local_d8,&local_3b8,&local_3d0);
  local_200 = &local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f0,"signature2",&local_3f1);
  local_410 = std::begin<std::array<unsigned_char,8ul>>(&ptStack_48->signature2);
  local_418 = std::end<std::array<unsigned_char,8ul>>(&ptStack_48->signature2);
  make_value<unsigned_char_const*,unsigned_char,std::shared_ptr<pstore::dump::value>(*)(unsigned_char_const&)>
            ((dump *)&local_408,&local_410,&local_418,
             details::default_make_value<unsigned_char_const&>);
  object::member::member(&local_a8,&local_3f0,&local_408);
  local_419 = 0;
  local_78 = &local_1f8;
  local_70 = 8;
  std::allocator<pstore::dump::object::member>::allocator(&local_41a);
  __l._M_len = local_70;
  __l._M_array = local_78;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_68,__l,&local_41a);
  make_value(this,&local_68);
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_68);
  std::allocator<pstore::dump::object::member>::~allocator(&local_41a);
  local_510 = (member *)&local_78;
  do {
    local_510 = local_510 + -1;
    object::member::~member(local_510);
  } while (local_510 != &local_1f8);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_408);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_3d0);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_388);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_348);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_310);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_290);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(local_248);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  vVar3.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar3.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (value_ptr)vVar3.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr make_value (trailer const & trailer, bool const no_times) {
            return make_value (object::container{
                {"signature1",
                 make_value (std::begin (trailer.a.signature1), std::end (trailer.a.signature1))},
                {"generation", make_value (trailer.a.generation.load ())},
                {"size", make_value (trailer.a.size.load ())},
                {"time", make_time (trailer.a.time, no_times)},
                {"prev_generation", make_value (trailer.a.prev_generation)},
                {"indices", make_value (std::begin (trailer.a.index_records),
                                        std::end (trailer.a.index_records))},
                {"crc", make_value (trailer.crc)},
                {"signature2",
                 make_value (std::begin (trailer.signature2), std::end (trailer.signature2))},
            });
        }